

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CB3DMeshFileLoader.cpp
# Opt level: O3

bool __thiscall irr::scene::CB3DMeshFileLoader::readChunkBRUS(CB3DMeshFileLoader *this)

{
  undefined1 *puVar1;
  pointer pSVar2;
  pointer pSVar3;
  SB3dTexture *pSVar4;
  SB3dTexture *pSVar5;
  long lVar6;
  int iVar7;
  uint uVar8;
  int iVar9;
  SColor SVar10;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  ulong uVar11;
  ushort uVar12;
  uint uVar13;
  u32 uVar14;
  void *pvVar15;
  pointer pSVar16;
  long lVar17;
  void *__src;
  int iVar18;
  long lVar19;
  ulong uVar20;
  ulong uVar21;
  undefined4 extraout_XMM0_Da;
  undefined4 extraout_XMM0_Db;
  u32 n_texs;
  string name;
  s32 texture_id;
  uint local_16c;
  ulong local_168;
  ulong local_160;
  long local_158;
  array<irr::scene::SB3dMaterial> *local_150;
  string local_148;
  SB3dMaterial local_128;
  
  (**this->B3DFile->_vptr_IReadFile)(this->B3DFile,&local_16c,4);
  uVar8 = local_16c;
  local_168 = 4;
  if (local_16c < 4) {
    local_168 = (ulong)local_16c;
  }
  iVar7 = local_16c - (uint)local_168;
  if (local_16c < (uint)local_168) {
    iVar7 = 0;
  }
  lVar19 = *(long *)&(this->super_IMeshLoader).field_0x10;
  iVar18 = *(int *)(lVar19 + -0xc);
  lVar19 = *(long *)(lVar19 + -8);
  iVar9 = (*this->B3DFile->_vptr_IReadFile[3])();
  if (CONCAT44(extraout_var,iVar9) < iVar18 + lVar19) {
    local_150 = &this->Materials;
    uVar11 = (ulong)((int)local_168 - 1);
    uVar21 = local_168 & 0xffffffff;
    local_158 = uVar11 * 8 + -0x18;
    local_160 = uVar11;
    do {
      readString_abi_cxx11_(&local_148,this);
      video::SMaterial::SMaterial(&local_128.Material);
      local_128.red = 1.0;
      local_128.green = 1.0;
      local_128.blue = 1.0;
      local_128.alpha = 1.0;
      local_128.shininess = 0.0;
      local_128.blend = 1;
      local_128.fx = 0;
      local_128.Textures[2] = (SB3dTexture *)0x0;
      local_128.Textures[3] = (SB3dTexture *)0x0;
      local_128.Textures[0] = (SB3dTexture *)0x0;
      local_128.Textures[1] = (SB3dTexture *)0x0;
      ::std::vector<irr::scene::SB3dMaterial,_std::allocator<irr::scene::SB3dMaterial>_>::
      emplace_back<irr::scene::SB3dMaterial>(&local_150->m_data,&local_128);
      (this->Materials).is_sorted = false;
      lVar19 = 0x80;
      do {
        pvVar15 = *(void **)((long)local_128.Material.TextureLayers + lVar19 + -8);
        if (pvVar15 != (void *)0x0) {
          operator_delete(pvVar15,0x40);
        }
        lVar19 = lVar19 + -0x20;
      } while (lVar19 != 0);
      pSVar2 = (this->Materials).m_data.
               super__Vector_base<irr::scene::SB3dMaterial,_std::allocator<irr::scene::SB3dMaterial>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      (**this->B3DFile->_vptr_IReadFile)(this->B3DFile,&pSVar2[-1].red,4);
      (**this->B3DFile->_vptr_IReadFile)(this->B3DFile,&pSVar2[-1].green,4);
      (**this->B3DFile->_vptr_IReadFile)(this->B3DFile,&pSVar2[-1].blue,4);
      (**this->B3DFile->_vptr_IReadFile)(this->B3DFile,&pSVar2[-1].alpha,4);
      (**this->B3DFile->_vptr_IReadFile)(this->B3DFile,&pSVar2[-1].shininess,4);
      (**this->B3DFile->_vptr_IReadFile)(this->B3DFile,&pSVar2[-1].blend,4);
      (**this->B3DFile->_vptr_IReadFile)(this->B3DFile,&pSVar2[-1].fx,4);
      if (uVar8 != 0) {
        uVar20 = 0;
        do {
          local_128.Material.TextureLayers[0].Texture =
               (ITexture *)CONCAT44(local_128.Material.TextureLayers[0].Texture._4_4_,0xffffffff);
          (**this->B3DFile->_vptr_IReadFile)(this->B3DFile,&local_128,4);
          uVar11 = local_160;
          pSVar3 = (this->Textures).m_data.
                   super__Vector_base<irr::scene::SB3dTexture,_std::allocator<irr::scene::SB3dTexture>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          pSVar16 = pSVar3 + ((ulong)local_128.Material.TextureLayers[0].Texture & 0xffffffff);
          if ((uint)((ulong)((long)(this->Textures).m_data.
                                   super__Vector_base<irr::scene::SB3dTexture,_std::allocator<irr::scene::SB3dTexture>_>
                                   ._M_impl.super__Vector_impl_data._M_finish - (long)pSVar3) >> 6)
              <= (uint)local_128.Material.TextureLayers[0].Texture) {
            pSVar16 = (pointer)0x0;
          }
          *(pointer *)((long)((pSVar2->Material).TextureLayers + -1) + uVar20 * 8) = pSVar16;
          uVar20 = uVar20 + 1;
        } while (uVar21 != uVar20);
        iVar18 = iVar7;
        if (4 < uVar8) {
          do {
            local_128.Material.TextureLayers[0].Texture =
                 (ITexture *)CONCAT44(local_128.Material.TextureLayers[0].Texture._4_4_,0xffffffff);
            (**this->B3DFile->_vptr_IReadFile)(this->B3DFile,&local_128,4);
            if (((this->ShowWarning == true) &&
                ((uint)local_128.Material.TextureLayers[0].Texture != -1)) && (4 < local_16c)) {
              (*this->B3DFile->_vptr_IReadFile[4])();
              os::Printer::log((double)CONCAT44(extraout_XMM0_Db,extraout_XMM0_Da));
              this->ShowWarning = false;
            }
            iVar18 = iVar18 + -1;
          } while (iVar18 != 0);
        }
      }
      pSVar4 = pSVar2[-1].Textures[0];
      if ((pSVar4 != (SB3dTexture *)0x0) && ((pSVar4->Flags & 0x10000) != 0)) {
        pSVar5 = pSVar2[-1].Textures[1];
        pSVar2[-1].Textures[1] = pSVar4;
        pSVar2[-1].Textures[0] = pSVar5;
      }
      if (uVar8 != 0) {
        lVar19 = 0;
        uVar20 = local_168;
        do {
          uVar13 = (int)uVar20 - 1;
          uVar20 = (ulong)uVar13;
          lVar17 = lVar19;
          if (uVar13 < (uint)uVar11) {
            do {
              lVar6 = *(long *)((long)&(pSVar2->Material).TextureLayers[0].Texture +
                               lVar17 * 8 + local_158);
              if ((lVar6 != 0) &&
                 (*(long *)((long)(pSVar2->Material).TextureLayers + lVar17 * 8 + local_158 + -8) ==
                  0)) {
                *(long *)((long)(pSVar2->Material).TextureLayers + lVar17 * 8 + local_158 + -8) =
                     lVar6;
                *(undefined8 *)
                 ((long)&(pSVar2->Material).TextureLayers[0].Texture + lVar17 * 8 + local_158) = 0;
              }
              lVar17 = lVar17 + 1;
            } while ((int)lVar17 != 0);
          }
          lVar19 = lVar19 + -1;
        } while (uVar13 != 0);
      }
      if (pSVar2[-1].Textures[1] == (SB3dTexture *)0x0) {
        if (pSVar2[-1].Textures[0] == (SB3dTexture *)0x0) {
LAB_001aede0:
          if (((float)pSVar2[-1].alpha != 1.0) || (NAN((float)pSVar2[-1].alpha))) goto LAB_001aed16;
          pSVar2[-1].Material.MaterialType = EMT_SOLID;
        }
        else {
          uVar13 = pSVar2[-1].Textures[0]->Flags;
          if ((uVar13 & 2) != 0) {
            pSVar2[-1].Material.MaterialType = EMT_TRANSPARENT_ALPHA_CHANNEL;
            goto LAB_001aed1d;
          }
          if ((uVar13 & 4) == 0) goto LAB_001aede0;
          pSVar2[-1].Material.MaterialType = EMT_TRANSPARENT_ALPHA_CHANNEL_REF;
        }
      }
      else {
LAB_001aed16:
        pSVar2[-1].Material.MaterialType = EMT_TRANSPARENT_VERTEX_ALPHA;
LAB_001aed1d:
        puVar1 = &pSVar2[-1].Material.field_0xb0;
        *puVar1 = *puVar1 & 0xcf;
      }
      local_128.Material.TextureLayers[0].Texture = *(ITexture **)&pSVar2[-1].red;
      local_128.Material.TextureLayers[0]._8_4_ = pSVar2[-1].blue;
      local_128.Material.TextureLayers[0].MinFilter = (E_TEXTURE_MIN_FILTER)pSVar2[-1].alpha;
      SVar10 = video::SColorf::toSColor((SColorf *)&local_128);
      pSVar2[-1].Material.DiffuseColor.color = SVar10.color;
      uVar12 = *(ushort *)&pSVar2[-1].Material.field_0xa2 & 0xff8f;
      *(ushort *)&pSVar2[-1].Material.field_0xa2 = uVar12;
      uVar13 = pSVar2[-1].fx;
      if ((uVar13 & 1) == 0) {
        uVar14 = pSVar2[-1].Material.DiffuseColor.color;
      }
      else {
        puVar1 = &pSVar2[-1].Material.field_0xb0;
        *puVar1 = *puVar1 & 0xf7;
        uVar14 = 0xffffffff;
      }
      pSVar2[-1].Material.AmbientColor.color = uVar14;
      if ((uVar13 & 2) != 0) {
        *(ushort *)&pSVar2[-1].Material.field_0xa2 = uVar12 | 0x50;
      }
      if ((uVar13 & 4) != 0) {
        puVar1 = &pSVar2[-1].Material.field_0xb0;
        *puVar1 = *puVar1 & 0xfb;
      }
      if ((uVar13 & 0x10) != 0) {
        puVar1 = &pSVar2[-1].Material.field_0xb0;
        *puVar1 = *puVar1 & 0xbf;
      }
      if ((uVar13 & 0x20) != 0) {
        pSVar2[-1].Material.MaterialType = EMT_TRANSPARENT_VERTEX_ALPHA;
        puVar1 = &pSVar2[-1].Material.field_0xb0;
        *puVar1 = *puVar1 & 0xcf;
      }
      pSVar2[-1].Material.Shininess = pSVar2[-1].shininess;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_148._M_dataplus._M_p != &local_148.field_2) {
        operator_delete(local_148._M_dataplus._M_p,local_148.field_2._M_allocated_capacity + 1);
      }
      lVar19 = *(long *)&(this->super_IMeshLoader).field_0x10;
      iVar18 = *(int *)(lVar19 + -0xc);
      lVar19 = *(long *)(lVar19 + -8);
      iVar9 = (*this->B3DFile->_vptr_IReadFile[3])();
    } while (CONCAT44(extraout_var_00,iVar9) < iVar18 + lVar19);
  }
  lVar19 = *(long *)&(this->super_IMeshLoader).field_0x8;
  pvVar15 = *(void **)&(this->super_IMeshLoader).field_0x10;
  uVar11 = (long)pvVar15 + (0xffffffff0 - lVar19) & 0xffffffff0;
  __src = (void *)(lVar19 + uVar11 + 0x10);
  if (__src != pvVar15) {
    memmove((void *)(lVar19 + uVar11),__src,(long)pvVar15 - (long)__src);
    pvVar15 = *(void **)&(this->super_IMeshLoader).field_0x10;
  }
  *(long *)&(this->super_IMeshLoader).field_0x10 = (long)pvVar15 + -0x10;
  return true;
}

Assistant:

bool CB3DMeshFileLoader::readChunkBRUS()
{
#ifdef _B3D_READER_DEBUG
	core::stringc logStr;
	for (u32 i = 1; i < B3dStack.size(); ++i)
		logStr += "-";
	logStr += "read ChunkBRUS";
	os::Printer::log(logStr.c_str(), ELL_DEBUG);
#endif

	u32 n_texs;
	B3DFile->read(&n_texs, sizeof(u32));
#ifdef __BIG_ENDIAN__
	n_texs = os::Byteswap::byteswap(n_texs);
#endif

	// number of texture ids read for Irrlicht
	const u32 num_textures = core::min_(n_texs, video::MATERIAL_MAX_TEXTURES);
	// number of bytes to skip (for ignored texture ids)
	const u32 n_texs_offset = (num_textures < n_texs) ? (n_texs - num_textures) : 0;

	while ((B3dStack.getLast().startposition + B3dStack.getLast().length) > B3DFile->getPos()) // this chunk repeats
	{
		// This is what blitz basic calls a brush, like a Irrlicht Material

		auto name = readString();
#ifdef _B3D_READER_DEBUG
		os::Printer::log("read Material", name.c_str(), ELL_DEBUG);
#endif
		Materials.push_back(SB3dMaterial());
		SB3dMaterial &B3dMaterial = Materials.getLast();

		readFloats(&B3dMaterial.red, 1);
		readFloats(&B3dMaterial.green, 1);
		readFloats(&B3dMaterial.blue, 1);
		readFloats(&B3dMaterial.alpha, 1);
		readFloats(&B3dMaterial.shininess, 1);

		B3DFile->read(&B3dMaterial.blend, sizeof(B3dMaterial.blend));
		B3DFile->read(&B3dMaterial.fx, sizeof(B3dMaterial.fx));
#ifdef __BIG_ENDIAN__
		B3dMaterial.blend = os::Byteswap::byteswap(B3dMaterial.blend);
		B3dMaterial.fx = os::Byteswap::byteswap(B3dMaterial.fx);
#endif
#ifdef _B3D_READER_DEBUG
		os::Printer::log("Blend", core::stringc(B3dMaterial.blend).c_str(), ELL_DEBUG);
		os::Printer::log("FX", core::stringc(B3dMaterial.fx).c_str(), ELL_DEBUG);
#endif

		u32 i;
		for (i = 0; i < num_textures; ++i) {
			s32 texture_id = -1;
			B3DFile->read(&texture_id, sizeof(s32));
#ifdef __BIG_ENDIAN__
			texture_id = os::Byteswap::byteswap(texture_id);
#endif
			//--- Get pointers to the texture, based on the IDs ---
			if ((u32)texture_id < Textures.size()) {
				B3dMaterial.Textures[i] = &Textures[texture_id];
#ifdef _B3D_READER_DEBUG
				os::Printer::log("Layer", core::stringc(i).c_str(), ELL_DEBUG);
				os::Printer::log("using texture", Textures[texture_id].TextureName.c_str(), ELL_DEBUG);
#endif
			} else
				B3dMaterial.Textures[i] = 0;
		}
		// skip other texture ids
		for (i = 0; i < n_texs_offset; ++i) {
			s32 texture_id = -1;
			B3DFile->read(&texture_id, sizeof(s32));
#ifdef __BIG_ENDIAN__
			texture_id = os::Byteswap::byteswap(texture_id);
#endif
			if (ShowWarning && (texture_id != -1) && (n_texs > video::MATERIAL_MAX_TEXTURES)) {
				os::Printer::log("Too many textures used in one material", B3DFile->getFileName(), ELL_WARNING);
				ShowWarning = false;
			}
		}

		// Fixes problems when the lightmap is on the first texture:
		if (B3dMaterial.Textures[0] != 0) {
			if (B3dMaterial.Textures[0]->Flags & 65536) { // 65536 = secondary UV
				SB3dTexture *TmpTexture;
				TmpTexture = B3dMaterial.Textures[1];
				B3dMaterial.Textures[1] = B3dMaterial.Textures[0];
				B3dMaterial.Textures[0] = TmpTexture;
			}
		}

		// If a preceeding texture slot is empty move the others down:
		for (i = num_textures; i > 0; --i) {
			for (u32 j = i - 1; j < num_textures - 1; ++j) {
				if (B3dMaterial.Textures[j + 1] != 0 && B3dMaterial.Textures[j] == 0) {
					B3dMaterial.Textures[j] = B3dMaterial.Textures[j + 1];
					B3dMaterial.Textures[j + 1] = 0;
				}
			}
		}

		//------ Convert blitz flags/blend to irrlicht -------

		// Two textures:
		if (B3dMaterial.Textures[1]) {
			B3dMaterial.Material.MaterialType = video::EMT_TRANSPARENT_VERTEX_ALPHA;
			B3dMaterial.Material.ZWriteEnable = video::EZW_OFF;
		} else if (B3dMaterial.Textures[0]) { // One texture:
			// Flags & 0x1 is usual SOLID, 0x8 is mipmap (handled before)
			if (B3dMaterial.Textures[0]->Flags & 0x2) { // (Alpha mapped)
				B3dMaterial.Material.MaterialType = video::EMT_TRANSPARENT_ALPHA_CHANNEL;
				B3dMaterial.Material.ZWriteEnable = video::EZW_OFF;
			} else if (B3dMaterial.Textures[0]->Flags & 0x4)                                  //(Masked)
				B3dMaterial.Material.MaterialType = video::EMT_TRANSPARENT_ALPHA_CHANNEL_REF; // TODO: create color key texture
			else if (B3dMaterial.alpha == 1.f)
				B3dMaterial.Material.MaterialType = video::EMT_SOLID;
			else {
				B3dMaterial.Material.MaterialType = video::EMT_TRANSPARENT_VERTEX_ALPHA;
				B3dMaterial.Material.ZWriteEnable = video::EZW_OFF;
			}
		} else // No texture:
		{
			if (B3dMaterial.alpha == 1.f)
				B3dMaterial.Material.MaterialType = video::EMT_SOLID;
			else {
				B3dMaterial.Material.MaterialType = video::EMT_TRANSPARENT_VERTEX_ALPHA;
				B3dMaterial.Material.ZWriteEnable = video::EZW_OFF;
			}
		}

		B3dMaterial.Material.DiffuseColor = video::SColorf(B3dMaterial.red, B3dMaterial.green, B3dMaterial.blue, B3dMaterial.alpha).toSColor();
		B3dMaterial.Material.ColorMaterial = video::ECM_NONE;

		//------ Material fx ------

		if (B3dMaterial.fx & 1) { // full-bright
			B3dMaterial.Material.AmbientColor = video::SColor(255, 255, 255, 255);
			B3dMaterial.Material.Lighting = false;
		} else
			B3dMaterial.Material.AmbientColor = B3dMaterial.Material.DiffuseColor;

		if (B3dMaterial.fx & 2) // use vertex colors instead of brush color
			B3dMaterial.Material.ColorMaterial = video::ECM_DIFFUSE_AND_AMBIENT;

		if (B3dMaterial.fx & 4) // flatshaded
			B3dMaterial.Material.GouraudShading = false;

		if (B3dMaterial.fx & 16) // disable backface culling
			B3dMaterial.Material.BackfaceCulling = false;

		if (B3dMaterial.fx & 32) { // force vertex alpha-blending
			B3dMaterial.Material.MaterialType = video::EMT_TRANSPARENT_VERTEX_ALPHA;
			B3dMaterial.Material.ZWriteEnable = video::EZW_OFF;
		}

		B3dMaterial.Material.Shininess = B3dMaterial.shininess;
	}

	B3dStack.erase(B3dStack.size() - 1);

	return true;
}